

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tree.cxx
# Opt level: O0

int __thiscall Fl_Tree::remove(Fl_Tree *this,char *__filename)

{
  Fl_Tree_Item *this_00;
  Fl_Tree_Item *parent;
  Fl_Tree_Item *item_local;
  Fl_Tree *this_local;
  
  if ((Fl_Tree_Item *)__filename == this->_item_focus) {
    this->_item_focus = (Fl_Tree_Item *)0x0;
  }
  if ((Fl_Tree_Item *)__filename == this->_root) {
    clear(this);
  }
  else {
    this_00 = Fl_Tree_Item::parent((Fl_Tree_Item *)__filename);
    if (this_00 == (Fl_Tree_Item *)0x0) {
      return -1;
    }
    Fl_Tree_Item::remove_child(this_00,(Fl_Tree_Item *)__filename);
  }
  return 0;
}

Assistant:

int Fl_Tree::remove(Fl_Tree_Item *item) {
  // Item being removed is focus item? zero focus
  if ( item == _item_focus ) _item_focus = 0;
#if FLTK_ABI_VERSION >= 10301
  if ( item == _lastselect ) _lastselect = 0;
#endif /*FLTK_ABI_VERSION*/
  if ( item == _root ) {
    clear();
  } else {
    Fl_Tree_Item *parent = item->parent();	// find item's parent
    if ( ! parent ) return(-1);
    parent->remove_child(item);			// remove child + children
  }
  return(0);
}